

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_optimizer.cpp
# Opt level: O0

void __thiscall glslopt_ctx::glslopt_ctx(glslopt_ctx *this,glslopt_target target)

{
  void *pvVar1;
  glslopt_target target_local;
  glslopt_ctx *this_local;
  
  this->target = target;
  pvVar1 = ralloc_context((void *)0x0);
  this->mem_ctx = pvVar1;
  initialize_mesa_context(&this->mesa_ctx,target);
  return;
}

Assistant:

glslopt_ctx (glslopt_target target) {
		this->target = target;
		mem_ctx = ralloc_context (NULL);
		initialize_mesa_context (&mesa_ctx, target);
	}